

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_modarith(_func_mp_int_ptr_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_modarith)

{
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  size_t sVar1;
  mp_int *x_02;
  ulong uVar2;
  
  x = mp_new(0x100);
  x_00 = mp_new(0x100);
  x_01 = mp_new(0x100);
  sVar1 = (*looplimit)(8);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      sVar1 = mp_max_bits(x);
      mp_random_bits_into(x,sVar1);
      sVar1 = mp_max_bits(x_00);
      mp_random_bits_into(x_00,sVar1);
      sVar1 = mp_max_bits(x_01);
      mp_random_bits_into(x_01,sVar1);
      mp_set_bit(x_01,0,1);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      x_02 = (*mp_modarith)(x,x_00,x_01);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      mp_free(x_02);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(8);
    } while (uVar2 < sVar1);
  }
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_modarith(
    mp_int *(*mp_modarith)(mp_int *x, mp_int *y, mp_int *modulus))
{
    mp_int *base = mp_new(256);
    mp_int *exponent = mp_new(256);
    mp_int *modulus = mp_new(256);

    for (size_t i = 0; i < looplimit(8); i++) {
        mp_random_fill(base);
        mp_random_fill(exponent);
        mp_random_fill(modulus);
        mp_set_bit(modulus, 0, 1);    /* we only support odd moduli */

        log_start();
        mp_int *out = mp_modarith(base, exponent, modulus);
        log_end();

        mp_free(out);
    }

    mp_free(base);
    mp_free(exponent);
    mp_free(modulus);
}